

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,2,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  pointer pMVar2;
  pointer pMVar3;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar4;
  pointer pcVar5;
  byte bVar6;
  Vector<tcu::Interval,_2> *pVVar7;
  PrecisionCase *pPVar8;
  FloatFormat *fmt;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  ContextType type;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  char *__s;
  size_t sVar15;
  long *plVar16;
  ShaderExecutor *pSVar17;
  IVal *pIVar18;
  long lVar19;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  Matrix<float,_2,_2> *val;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  *pVVar21;
  IVal *pIVar22;
  ulong uVar23;
  byte bVar24;
  IVal in2;
  IVal in3;
  IVal in1;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  outputs;
  Environment env;
  FuncSet funcs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_588 [8];
  PrecisionCase *local_580;
  undefined1 local_578 [8];
  float local_570;
  float fStack_56c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  *local_558;
  size_t local_550;
  Statement *local_548;
  string local_540;
  ulong local_520;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_518;
  undefined1 local_510 [16];
  undefined1 local_500 [88];
  undefined1 local_4a8 [8];
  pointer pVStack_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  _Rb_tree_node_base *p_Stack_488;
  Data local_480;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  double local_468;
  Interval local_460;
  ios_base local_438 [8];
  ios_base local_430 [264];
  FloatFormat local_328;
  ulong local_300;
  FloatFormat *local_2f8;
  ulong local_2f0;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  local_2e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b8;
  undefined1 local_288 [12];
  YesNoMaybe YStack_27c;
  _Base_ptr local_278;
  _Rb_tree_node_base *local_270;
  _Rb_tree_node_base *p_Stack_268;
  double local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_258;
  double dStack_250;
  double local_248;
  Interval local_240;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [32];
  _Rb_tree_node_base *p_Stack_188;
  double local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_178;
  double dStack_170;
  double local_168;
  Interval local_160;
  ios_base local_138 [264];
  
  pMVar2 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_550 = (long)pMVar3 - (long)pMVar2 >> 4;
  local_548 = stmt;
  local_518 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>_>_>
  ::Outputs(&local_2e8,local_550);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_328.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_328.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_328.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_328.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_328.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_328.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_328.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_328.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_328._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4a8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"Statement: ",0xb);
  (*local_548->_vptr_Statement[2])(local_548,(ostringstream *)&pVStack_4a0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_580 = this;
  local_558 = variables;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
  std::ios_base::~ios_base(local_430);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_288 + 8);
  stack0xfffffffffffffd80 = (pointer)((ulong)YStack_27c << 0x20);
  local_278 = (_Base_ptr)0x0;
  local_260 = 0.0;
  local_270 = p_Var1;
  p_Stack_268 = p_Var1;
  (*local_548->_vptr_Statement[4])(local_548,local_288);
  if (local_270 != p_Var1) {
    p_Var14 = local_270;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var1);
  }
  pPVar8 = local_580;
  if (local_260 != 0.0) {
    local_4a8 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4a0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4a0,(char *)local_510._0_8_,local_510._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_510._0_8_ != (IVal *)local_500) {
      operator_delete((void *)local_510._0_8_,local_500._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
    std::ios_base::~ios_base(local_430);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_288);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"precision ",10);
  __s = glu::getPrecisionName((pPVar8->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_588 + *(long *)((long)local_4a8 + -0x18)) + 0xe0);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
  std::ios_base::~ios_base(local_438);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_580->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_580->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_580->m_extension);
    plVar16 = (long *)std::__cxx11::string::append(local_1a8);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar20) {
      local_498._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_498._8_8_ = plVar16[3];
      local_4a8 = (undefined1  [8])&local_498;
    }
    else {
      local_498._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_4a8 = (undefined1  [8])*plVar16;
    }
    pVStack_4a0 = (pointer)plVar16[1];
    *plVar16 = (long)paVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_4a8);
    if (local_4a8 != (undefined1  [8])&local_498) {
      operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_4a8,local_580,
             (local_558->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  uVar9 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_4a8);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&p_Stack_488);
  glu::VarType::~VarType((VarType *)&p_Stack_488);
  if (local_4a8 != (undefined1  [8])&local_498) {
    operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_4a8,local_580,
             (local_558->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_4a8);
  glu::VarType::operator=(&((pointer)(uVar9 + 0x38))->varType,(VarType *)&p_Stack_488);
  glu::VarType::~VarType((VarType *)&p_Stack_488);
  if (local_4a8 != (undefined1  [8])&local_498) {
    operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_4a8,local_580,
             (local_558->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_4a8);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&p_Stack_488);
  glu::VarType::~VarType((VarType *)&p_Stack_488);
  if (local_4a8 != (undefined1  [8])&local_498) {
    operator_delete((void *)local_4a8,local_498._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
  (*local_548->_vptr_Statement[2])(local_548,local_4a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
  std::ios_base::~ios_base(local_438);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
  }
  pPVar8 = local_580;
  pSVar17 = ShaderExecUtil::createExecutor
                      ((local_580->m_ctx).renderContext,(local_580->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  pVVar21 = local_558;
  local_4a8 = (undefined1  [8])
              (local_518->in0).
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_4a0 = (local_518->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_498._M_allocated_capacity =
       (size_type)
       (local_518->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_498._8_8_ =
       (local_518->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_2e8.out0.
       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_2e8.out1.
       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((pPVar8->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar12 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar12 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,local_550,local_4a8,local_1a8);
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_4a8);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_288);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_2b8,
             (pVVar21->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr,(IVal *)local_4a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar21->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_510);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar21->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_578);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar21->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_540);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_2b8,
             (pVVar21->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_2b8,
             (pVVar21->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr,(IVal *)local_288);
  if (pMVar3 == pMVar2) {
LAB_01744198:
    local_4a8 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4a0," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_2f8 = &(local_580->m_ctx).floatFormat;
    local_500._80_8_ = &local_580->m_status;
    local_300 = local_550 + (local_550 == 0);
    uVar23 = 0;
    local_520 = 0;
    do {
      fmt = local_2f8;
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_288);
      if ((uVar23 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_580->super_TestCase).super_TestNode.m_testCtx);
      }
      pMVar2 = (local_518->in0).
               super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_578._0_4_ = pMVar2[uVar23].m_data.m_data[0].m_data[0];
      local_570 = pMVar2[uVar23].m_data.m_data[1].m_data[0];
      local_578._4_4_ = pMVar2[uVar23].m_data.m_data[0].m_data[1];
      fStack_56c = pMVar2[uVar23].m_data.m_data[1].m_data[1];
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doRound
                ((IVal *)local_510,fmt,(Matrix<float,_2,_2> *)local_578);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_4a8,fmt,(IVal *)local_510);
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_2b8,
                           (pVVar21->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      (pIVar18->m_data).m_data[0].m_data[0].m_hi = (double)local_498._M_allocated_capacity;
      (pIVar18->m_data).m_data[0].m_data[0].m_hasNaN = local_4a8;
      (pIVar18->m_data).m_data[0].m_data[0].m_lo = (double)pVStack_4a0;
      (pIVar18->m_data).m_data[1].m_data[0].m_hi = local_468;
      *(undefined8 *)(pIVar18->m_data).m_data[1].m_data = local_480._8_8_;
      (pIVar18->m_data).m_data[1].m_data[0].m_lo = (double)CONCAT44(uStack_46c,uStack_470);
      *(undefined8 *)((pIVar18->m_data).m_data[0].m_data + 1) = local_498._8_8_;
      (pIVar18->m_data).m_data[0].m_data[1].m_lo = (double)p_Stack_488;
      (pIVar18->m_data).m_data[0].m_data[1].m_hi =
           (double)CONCAT44(local_480.basic.precision,local_480.basic.type);
      pVVar7 = (pIVar18->m_data).m_data;
      pVVar7[1].m_data[1].m_hasNaN = local_460.m_hasNaN;
      *(undefined7 *)&pVVar7[1].m_data[1].field_0x1 = local_460._1_7_;
      (pIVar18->m_data).m_data[1].m_data[1].m_lo = local_460.m_lo;
      (pIVar18->m_data).m_data[1].m_data[1].m_hi = local_460.m_hi;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b8,
                 (pVVar21->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b8,
                 (pVVar21->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b8,
                 (pVVar21->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_480.basic.type = (local_580->m_ctx).precision;
      p_Stack_488 = (_Rb_tree_node_base *)fmt->m_maxValue;
      local_4a8 = *(undefined1 (*) [8])fmt;
      pVStack_4a0 = *(pointer *)&fmt->m_fractionBits;
      local_498._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_498._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      uStack_470 = 0;
      local_480._8_8_ = &local_2b8;
      (*local_548->_vptr_Statement[3])(local_548,local_4a8);
      local_2f0 = uVar23;
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_2b8,
                           (pVVar21->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_4a8,&local_328,pIVar18);
      pMVar2 = local_2e8.out1.
               super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_278 = (_Base_ptr)local_498._M_allocated_capacity;
      local_288._0_8_ = local_4a8;
      stack0xfffffffffffffd80 = pVStack_4a0;
      local_248 = local_468;
      dStack_250 = (double)CONCAT44(uStack_46c,uStack_470);
      local_258 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
                   *)local_480._8_8_;
      local_260 = (double)CONCAT44(local_480.basic.precision,local_480.basic.type);
      local_270 = (_Rb_tree_node_base *)local_498._8_8_;
      p_Stack_268 = p_Stack_488;
      local_240.m_hi = local_460.m_hi;
      local_240.m_hasNaN = local_460.m_hasNaN;
      local_240._1_7_ = local_460._1_7_;
      local_240.m_lo = local_460.m_lo;
      bVar24 = 1;
      pIVar22 = (IVal *)local_288;
      lVar19 = 0;
      do {
        bVar10 = contains<tcu::Vector<float,2>>
                           (pIVar22,(Vector<float,_2> *)((long)pMVar2 + lVar19 * 8 + uVar23 * 0x10))
        ;
        lVar19 = 1;
        pIVar22 = (IVal *)&local_258;
        bVar6 = bVar24 & bVar10;
        bVar24 = 0;
      } while (bVar6 != 0);
      local_4a8 = (undefined1  [8])&local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 1 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check
                         ((ResultCollector *)local_500._80_8_,bVar10,(string *)local_4a8);
      pVVar21 = local_558;
      if (local_4a8 != (undefined1  [8])&local_498) {
        operator_delete((void *)local_4a8,(ulong)(local_498._M_allocated_capacity + 1));
      }
      pIVar18 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_2b8,
                           (pVVar21->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)local_4a8,&local_328,pIVar18);
      pMVar2 = local_2e8.out0.
               super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1a8._16_8_ = local_498._M_allocated_capacity;
      local_1a8._0_8_ = local_4a8;
      local_1a8._8_8_ = pVStack_4a0;
      local_168 = local_468;
      dStack_170 = (double)CONCAT44(uStack_46c,uStack_470);
      local_178 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
                   *)local_480._8_8_;
      local_180 = (double)CONCAT44(local_480.basic.precision,local_480.basic.type);
      local_1a8._24_8_ = local_498._8_8_;
      p_Stack_188 = p_Stack_488;
      local_160.m_hi = local_460.m_hi;
      local_160.m_hasNaN = local_460.m_hasNaN;
      local_160._1_7_ = local_460._1_7_;
      local_160.m_lo = local_460.m_lo;
      bVar24 = 1;
      pIVar22 = (IVal *)local_1a8;
      lVar19 = 0;
      do {
        bVar11 = contains<tcu::Vector<float,2>>
                           (pIVar22,(Vector<float,_2> *)
                                    (&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)(pMVar2 + uVar23))->_M_allocated_capacity + lVar19));
        lVar19 = 1;
        pIVar22 = (IVal *)&local_178;
        bVar6 = bVar24 & bVar11;
        bVar24 = 0;
      } while (bVar6 != 0);
      local_4a8 = (undefined1  [8])&local_498;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check
                         ((ResultCollector *)local_500._80_8_,bVar11,(string *)local_4a8);
      pVVar21 = local_558;
      if (local_4a8 != (undefined1  [8])&local_498) {
        operator_delete((void *)local_4a8,(ulong)(local_498._M_allocated_capacity + 1));
      }
      if (!bVar10 || !bVar11) {
        uVar13 = (int)local_520 + 1;
        local_520 = (ulong)uVar13;
        if ((int)uVar13 < 0x65) {
          local_4a8 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\t",1);
          pVVar4 = (pVVar21->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                   .m_ptr;
          val = (Matrix<float,_2,_2> *)local_500;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_510._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_510,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,(char *)local_510._0_8_,local_510._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," = ",3);
          valueToString<tcu::Matrix<float,2,2>>
                    ((string *)local_578,(BuiltinPrecisionTests *)&local_328,
                     (FloatFormat *)
                     ((local_518->in0).
                      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar23),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,(char *)CONCAT44(local_578._4_4_,local_578._0_4_),
                     CONCAT44(fStack_56c,local_570));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_578._4_4_,local_578._0_4_) != &local_568) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_578._4_4_,local_578._0_4_),
                            local_568._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_2,_2> *)local_510._0_8_ != (Matrix<float,_2,_2> *)local_500) {
            operator_delete((void *)local_510._0_8_,local_500._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\t",1);
          pVVar4 = (pVVar21->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                   .m_ptr;
          pIVar18 = (IVal *)local_500;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_510._0_8_ = pIVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_510,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,(char *)local_510._0_8_,local_510._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," = ",3);
          valueToString<tcu::Matrix<float,2,2>>
                    ((string *)local_578,(BuiltinPrecisionTests *)&local_328,
                     (FloatFormat *)
                     (local_2e8.out0.
                      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar23),
                     (Matrix<float,_2,_2> *)pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,(char *)CONCAT44(local_578._4_4_,local_578._0_4_),
                     CONCAT44(fStack_56c,local_570));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,2>>
                    (&local_540,(BuiltinPrecisionTests *)&local_328,(FloatFormat *)local_1a8,pIVar18
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,local_540._M_dataplus._M_p,local_540._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_578._4_4_,local_578._0_4_) != &local_568) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_578._4_4_,local_578._0_4_),
                            local_568._M_allocated_capacity + 1);
          }
          if ((IVal *)local_510._0_8_ != (IVal *)local_500) {
            operator_delete((void *)local_510._0_8_,local_500._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\t",1);
          pVVar4 = (pVVar21->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                   .m_ptr;
          pIVar18 = (IVal *)local_500;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_510._0_8_ = pIVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_510,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,(char *)local_510._0_8_,local_510._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," = ",3);
          valueToString<tcu::Matrix<float,2,2>>
                    ((string *)local_578,(BuiltinPrecisionTests *)&local_328,
                     (FloatFormat *)
                     ((long)local_2e8.out1.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar23 * 0x10),
                     (Matrix<float,_2,_2> *)pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,(char *)CONCAT44(local_578._4_4_,local_578._0_4_),
                     CONCAT44(fStack_56c,local_570));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,2>>
                    (&local_540,(BuiltinPrecisionTests *)&local_328,(FloatFormat *)local_288,pIVar18
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_4a0,local_540._M_dataplus._M_p,local_540._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_578._4_4_,local_578._0_4_) != &local_568) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_578._4_4_,local_578._0_4_),
                            local_568._M_allocated_capacity + 1);
          }
          if ((IVal *)local_510._0_8_ != (IVal *)local_500) {
            operator_delete((void *)local_510._0_8_,local_500._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
          std::ios_base::~ios_base(local_430);
        }
      }
      uVar23 = local_2f0 + 1;
    } while (uVar23 != local_300);
    iVar12 = (int)local_520;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_01744198;
    }
    else {
      local_4a8 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_4a0,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
      std::ios_base::~ios_base(local_430);
    }
    local_4a8 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_4a0);
    std::ostream::operator<<((ostringstream *)&pVStack_4a0,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_4a0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_4a0," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_4a0);
  std::ios_base::~ios_base(local_430);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if ((pointer)local_2e8.out1.
               super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.out0.
         super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
         _M_impl.super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}